

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONMemory.h
# Opt level: O2

JSONNode ** json_malloc<JSONNode*>(size_t count)

{
  JSONNode **ppJVar1;
  
  ppJVar1 = (JSONNode **)malloc(count << 3);
  return ppJVar1;
}

Assistant:

static inline T * json_malloc(size_t count) json_nothrow {
	   #ifdef JSON_DEBUG  //in debug mode, see if the malloc was successful
		  void * result = std::malloc(count * sizeof(T));
		  JSON_ASSERT(result != 0, JSON_TEXT("Out of memory"));
		  #ifdef JSON_NULL_MEMORY
			 std::memset(result, '\0', count  * sizeof(T));
		  #endif
		  return (T *)result;
	   #else
		  return (T *)std::malloc(count * sizeof(T));
	   #endif
    }